

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void GA_Scan_add(int g_a,int g_b,int g_sbit,int lo,int hi,int excl)

{
  pnga_scan_add((long)g_a,(long)g_b,(long)g_sbit,(long)(lo + 1),(long)(hi + 1),(long)excl);
  return;
}

Assistant:

void GA_Scan_add(int g_a, int g_b, int g_sbit, int lo,
                 int hi, int excl)
{
     Integer a = (Integer)g_a;
     Integer b = (Integer)g_b;
     Integer s = (Integer)g_sbit;
     Integer x = (Integer)excl;
     Integer alo = lo+1;
     Integer ahi = hi+1;
     wnga_scan_add(a, b, s, alo, ahi, x);

}